

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool mkvparser::Projection::Parse
               (IMkvReader *reader,longlong start,longlong size,Projection **projection)

{
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> uVar1;
  longlong lVar2;
  int iVar3;
  pointer __p;
  long lVar4;
  longlong lVar5;
  uchar *puVar6;
  bool bVar7;
  longlong lVar8;
  long stop;
  float fVar9;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  longlong read_pos;
  longlong child_size;
  double value;
  longlong child_id;
  __uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
  *local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*projection != (Projection *)0x0)) {
    bVar7 = false;
  }
  else {
    local_38 = (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
                *)projection;
    projection_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
    super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
          )operator_new(0x28);
    *(undefined4 *)
     projection_ptr._M_t.
     super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
     super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
     super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl = 0xffffffff;
    *(undefined8 *)
     ((long)projection_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
            .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 8) = 0;
    *(undefined8 *)
     ((long)projection_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
            .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)projection_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
            .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 0x18) =
         0x7f7fffff7f7fffff;
    *(undefined4 *)
     ((long)projection_ptr._M_t.
            super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ._M_t.
            super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
            .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 0x20) = 0x7f7fffff
    ;
    stop = size + start;
    read_pos = start;
    do {
      uVar1._M_t.
      super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t
      .super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
      super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
           projection_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl;
      bVar7 = stop <= read_pos;
      if (stop <= read_pos) {
        projection_ptr._M_t.
        super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>.
        _M_t.
        super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
        .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
             (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
              )(__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>)
               0x0;
        local_38->
        super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> =
             (__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>)
             uVar1._M_t.
             super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
             ._M_t.
             super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
             .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl;
        break;
      }
      child_id = 0;
      child_size = 0;
      lVar4 = ParseElementHeader(reader,&read_pos,stop,&child_id,&child_size);
      lVar5 = child_id;
      lVar2 = child_size;
      lVar8 = read_pos;
      if (lVar4 < 0) break;
      if (child_id == 0x7672) {
        if ((*(long *)((long)projection_ptr._M_t.
                             super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                             .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 8
                      ) != 0) ||
           (puVar6 = SafeArrayAlloc<unsigned_char>(1,child_size), lVar8 = read_pos,
           puVar6 == (uchar *)0x0)) break;
        iVar3 = (**reader->_vptr_IMkvReader)(reader,read_pos,lVar2,puVar6);
        if (iVar3 != 0) {
          operator_delete__(puVar6);
          break;
        }
        *(uchar **)
         ((long)projection_ptr._M_t.
                super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                ._M_t.
                super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 8) = puVar6;
        *(longlong *)
         ((long)projection_ptr._M_t.
                super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                ._M_t.
                super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl + 0x10) = lVar2;
      }
      else if (child_id == 0x7671) {
        lVar5 = UnserializeUInt(reader,read_pos,child_size);
        if (lVar5 < 0) break;
        *(int *)projection_ptr._M_t.
                super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                ._M_t.
                super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl = (int)lVar5;
      }
      else {
        value = 0.0;
        lVar4 = UnserializeFloat(reader,read_pos,child_size,&value);
        if (((lVar4 < 0) || (3.4028234663852886e+38 < ABS(value))) ||
           ((0.0 < value && (value < 1.1754943508222875e-38)))) break;
        fVar9 = (float)value;
        if (lVar5 == 0x7675) {
          *(float *)((long)projection_ptr._M_t.
                           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl +
                    0x20) = fVar9;
        }
        else if (lVar5 == 0x7674) {
          *(float *)((long)projection_ptr._M_t.
                           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl +
                    0x1c) = fVar9;
        }
        else {
          if (lVar5 != 0x7673) break;
          *(float *)((long)projection_ptr._M_t.
                           super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                           .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl +
                    0x18) = fVar9;
        }
      }
      read_pos = lVar8 + lVar2;
    } while (read_pos <= stop);
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              (&projection_ptr);
  }
  return bVar7;
}

Assistant:

bool Projection::Parse(IMkvReader* reader, long long start, long long size,
                       Projection** projection) {
  if (!reader || *projection)
    return false;

  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  const long long end = start + size;
  long long read_pos = start;

  while (read_pos < end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvProjectionType) {
      long long projection_type = kTypeNotPresent;
      projection_type = UnserializeUInt(reader, read_pos, child_size);
      if (projection_type < 0)
        return false;

      projection_ptr->type = static_cast<ProjectionType>(projection_type);
    } else if (child_id == libwebm::kMkvProjectionPrivate) {
      if (projection_ptr->private_data != NULL)
        return false;
      unsigned char* data = SafeArrayAlloc<unsigned char>(1, child_size);

      if (data == NULL)
        return false;

      const int status =
          reader->Read(read_pos, static_cast<long>(child_size), data);

      if (status) {
        delete[] data;
        return false;
      }

      projection_ptr->private_data = data;
      projection_ptr->private_data_length = static_cast<size_t>(child_size);
    } else {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      // Make sure value is representable as a float before casting.
      if (value_parse_status < 0 || value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }

      switch (child_id) {
        case libwebm::kMkvProjectionPoseYaw:
          projection_ptr->pose_yaw = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPosePitch:
          projection_ptr->pose_pitch = static_cast<float>(value);
          break;
        case libwebm::kMkvProjectionPoseRoll:
          projection_ptr->pose_roll = static_cast<float>(value);
          break;
        default:
          return false;
      }
    }

    read_pos += child_size;
    if (read_pos > end)
      return false;
  }

  *projection = projection_ptr.release();
  return true;
}